

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

void __thiscall
booster::aio::stream_socket::async_connect(stream_socket *this,endpoint *ep,event_handler *h)

{
  callable<void_(const_std::error_code_&)> *pcVar1;
  bool bVar2;
  pointer_type pVar3;
  io_service *this_00;
  socklen_t in_ECX;
  atomic_counter *this_01;
  error_code e;
  event_handler local_40;
  error_code local_38;
  
  bVar2 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (bVar2) {
    local_38._M_value = 0;
    local_38._M_cat = (error_category *)std::_V2::system_category();
    connect(this,(int)ep,(sockaddr *)&local_38,in_ECX);
    if ((local_38._M_value != 0) && (bVar2 = basic_io_device::would_block(&local_38), bVar2)) {
      pVar3.p_ = (callable<void_(const_std::error_code_&)> *)operator_new(0x20);
      ((pVar3.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_001cfeb0;
      this_01 = &((pVar3.p_)->super_refcounted).refs_;
      atomic_counter::atomic_counter(this_01,0);
      ((pVar3.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__async_connector_001d0340
      ;
      pcVar1 = (h->call_ptr).p_;
      pVar3.p_[1].super_refcounted._vptr_refcounted = (_func_int **)pcVar1;
      if (pcVar1 != (callable<void_(const_std::error_code_&)> *)0x0) {
        atomic_counter::inc(&(pcVar1->super_refcounted).refs_);
      }
      pVar3.p_[1].super_refcounted.refs_.value_.super___atomic_base<long>._M_i = (__int_type)this;
      local_40.call_ptr.p_ = (pointer_type)(pointer_type)pVar3.p_;
      atomic_counter::inc(this_01);
      basic_io_device::on_writeable((basic_io_device *)this,&local_40);
      intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                (&local_40.call_ptr);
      return;
    }
    this_00 = basic_io_device::get_io_service((basic_io_device *)this);
    io_service::post(this_00,h,&local_38);
  }
  return;
}

Assistant:

void stream_socket::async_connect(endpoint const &ep,event_handler const &h)
{
	if(!dont_block(h))
		return;
	system::error_code e;
	connect(ep,e);
	if(e && would_block(e)) {
		async_connector::pointer connector(new async_connector(h,this));
		on_writeable(std::move(connector));
	}
	else {
		get_io_service().post(h,e);
	}
}